

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

uint Lib::List<unsigned_int>::pop(List<unsigned_int> **lst)

{
  uint uVar1;
  List<unsigned_int> *pLVar2;
  undefined8 *in_RDI;
  uint result;
  List<unsigned_int> *tail;
  size_t in_stack_ffffffffffffffd8;
  
  pLVar2 = List<unsigned_int>::tail((List<unsigned_int> *)*in_RDI);
  uVar1 = head((List<unsigned_int> *)*in_RDI);
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete((void *)*in_RDI,in_stack_ffffffffffffffd8);
  }
  *in_RDI = pLVar2;
  return uVar1;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }